

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O1

int secp256k1_ecmult_pippenger_batch
              (secp256k1_callback *error_callback,secp256k1_scratch *scratch,secp256k1_gej *r,
              secp256k1_scalar *inp_g_sc,secp256k1_ecmult_multi_callback *cb,void *cbdata,
              size_t n_points,size_t cb_offset)

{
  long lVar1;
  bool bVar2;
  ulong uVar3;
  byte bVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  secp256k1_ge *p1;
  secp256k1_scalar *s1;
  long *plVar12;
  void *pvVar13;
  secp256k1_gej *r_00;
  secp256k1_ge *psVar14;
  ulong uVar15;
  int iVar16;
  uint uVar17;
  size_t checkpoint;
  secp256k1_scalar *psVar18;
  secp256k1_gej *psVar19;
  size_t __n;
  long lVar20;
  long lVar21;
  long lVar22;
  secp256k1_ge *psVar23;
  int *piVar24;
  long lVar25;
  long lVar26;
  byte bVar27;
  undefined1 auVar28 [16];
  secp256k1_gej running_sum;
  long local_148;
  ulong local_140;
  size_t local_f0;
  undefined1 local_b8 [32];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  uint64_t local_48;
  int local_40;
  
  bVar27 = 0;
  lVar11 = 0;
  do {
    iVar16 = (uint)scratch->magic[lVar11] - (uint)(byte)"scratch"[lVar11];
    if (scratch->magic[lVar11] != "scratch"[lVar11]) goto LAB_00164ef6;
    lVar11 = lVar11 + 1;
  } while (lVar11 != 8);
  iVar16 = 0;
LAB_00164ef6:
  if (iVar16 == 0) {
    checkpoint = scratch->alloc_size;
  }
  else {
    (*error_callback->fn)("invalid scratch space",error_callback->data);
    checkpoint = 0;
  }
  r->infinity = 1;
  (r->x).n[0] = 0;
  (r->x).n[1] = 0;
  (r->x).n[2] = 0;
  (r->x).n[3] = 0;
  *(undefined1 (*) [16])((r->x).n + 4) = (undefined1  [16])0x0;
  (r->y).n[1] = 0;
  (r->y).n[2] = 0;
  (r->y).n[3] = 0;
  (r->y).n[4] = 0;
  (r->z).n[0] = 0;
  (r->z).n[1] = 0;
  (r->z).n[2] = 0;
  (r->z).n[3] = 0;
  (r->z).n[4] = 0;
  iVar16 = 1;
  if (inp_g_sc != (secp256k1_scalar *)0x0 || n_points != 0) {
    lVar11 = n_points * 2 + 2;
    local_f0 = n_points;
    uVar9 = secp256k1_pippenger_bucket_window(n_points);
    p1 = (secp256k1_ge *)secp256k1_scratch_alloc(error_callback,scratch,lVar11 * 0x58);
    s1 = (secp256k1_scalar *)secp256k1_scratch_alloc(error_callback,scratch,lVar11 * 0x20);
    plVar12 = (long *)secp256k1_scratch_alloc(error_callback,scratch,0x10);
    if ((plVar12 == (long *)0x0 || s1 == (secp256k1_scalar *)0x0) || p1 == (secp256k1_ge *)0x0) {
LAB_00164fea:
      iVar16 = 0;
    }
    else {
      pvVar13 = secp256k1_scratch_alloc(error_callback,scratch,lVar11 * 0x10);
      plVar12[1] = (long)pvVar13;
      uVar17 = uVar9 + 1;
      iVar16 = 0;
      pvVar13 = secp256k1_scratch_alloc
                          (error_callback,scratch,
                           lVar11 * ((ulong)(uVar9 | 0x80) / (ulong)uVar17) * 4);
      *plVar12 = (long)pvVar13;
      bVar4 = (byte)uVar9;
      r_00 = (secp256k1_gej *)
             secp256k1_scratch_alloc(error_callback,scratch,0x80L << (bVar4 & 0x3f));
      if ((plVar12[1] != 0) && (r_00 != (secp256k1_gej *)0x0 && *plVar12 != 0)) {
        if (inp_g_sc == (secp256k1_scalar *)0x0) {
          lVar11 = 0;
        }
        else {
          uVar5 = inp_g_sc->d[0];
          uVar6 = inp_g_sc->d[1];
          uVar7 = inp_g_sc->d[3];
          s1->d[2] = inp_g_sc->d[2];
          s1->d[3] = uVar7;
          s1->d[0] = uVar5;
          s1->d[1] = uVar6;
          psVar14 = &secp256k1_ge_const_g;
          psVar23 = p1;
          for (lVar11 = 0xb; lVar11 != 0; lVar11 = lVar11 + -1) {
            (psVar23->x).n[0] = (psVar14->x).n[0];
            psVar14 = (secp256k1_ge *)((long)psVar14 + ((ulong)bVar27 * -2 + 1) * 8);
            psVar23 = (secp256k1_ge *)((long)psVar23 + (ulong)bVar27 * -0x10 + 8);
          }
          secp256k1_ecmult_endo_split(s1,s1 + 1,p1,p1 + 1);
          lVar11 = 2;
        }
        if (n_points != 0) {
          psVar18 = (secp256k1_scalar *)((long)s1->d + (ulong)(uint)((int)lVar11 << 5));
          psVar14 = p1 + lVar11;
          do {
            iVar16 = (*cb)(psVar18,psVar14,cb_offset,cbdata);
            if (iVar16 == 0) goto LAB_00164fea;
            secp256k1_ecmult_endo_split(psVar18,psVar18 + 1,psVar14,psVar14 + 1);
            lVar11 = lVar11 + 2;
            cb_offset = cb_offset + 1;
            psVar18 = psVar18 + 2;
            psVar14 = psVar14 + 2;
            local_f0 = local_f0 - 1;
          } while (local_f0 != 0);
        }
        uVar8 = (ulong)uVar9;
        uVar3 = ((ulong)uVar9 | 0x80) / (ulong)uVar17;
        if (lVar11 == 0) {
          local_148 = 0;
        }
        else {
          piVar24 = &p1->infinity;
          lVar25 = 0;
          local_148 = 0;
          psVar14 = p1;
          psVar18 = s1;
          do {
            auVar28._0_4_ = -(uint)((int)psVar18->d[2] == 0 && (int)psVar18->d[0] == 0);
            auVar28._4_4_ =
                 -(uint)(*(int *)((long)psVar18->d + 0x14) == 0 &&
                        *(int *)((long)psVar18->d + 4) == 0);
            auVar28._8_4_ = -(uint)((int)psVar18->d[3] == 0 && (int)psVar18->d[1] == 0);
            auVar28._12_4_ =
                 -(uint)(*(int *)((long)psVar18->d + 0x1c) == 0 &&
                        *(int *)((long)psVar18->d + 0xc) == 0);
            uVar10 = movmskps((int)psVar14,auVar28);
            psVar14 = (secp256k1_ge *)(ulong)(uVar10 ^ 0xf);
            if (((uVar10 ^ 0xf) != 0) && (*piVar24 == 0)) {
              *(long *)(plVar12[1] + 8 + local_148 * 0x10) = lVar25;
              uVar10 = secp256k1_wnaf_fixed
                                 ((int *)(local_148 * uVar3 * 4 + *plVar12),psVar18,uVar17);
              psVar14 = (secp256k1_ge *)(ulong)uVar10;
              *(uint *)(plVar12[1] + local_148 * 0x10) = uVar10;
              local_148 = local_148 + 1;
            }
            lVar25 = lVar25 + 1;
            piVar24 = piVar24 + 0x16;
            psVar18 = psVar18 + 1;
          } while (lVar11 != lVar25);
        }
        r->infinity = 1;
        (r->x).n[0] = 0;
        (r->x).n[1] = 0;
        (r->x).n[2] = 0;
        (r->x).n[3] = 0;
        *(undefined1 (*) [16])((r->x).n + 4) = (undefined1  [16])0x0;
        (r->y).n[1] = 0;
        (r->y).n[2] = 0;
        (r->y).n[3] = 0;
        (r->y).n[4] = 0;
        (r->z).n[0] = 0;
        (r->z).n[1] = 0;
        (r->z).n[2] = 0;
        (r->z).n[3] = 0;
        (r->z).n[4] = 0;
        if (local_148 != 0) {
          lVar22 = 1L << (bVar4 & 0x3f);
          lVar20 = (ulong)((uVar9 + 0x80) / uVar17 - 1) << 2;
          uVar15 = (ulong)((int)lVar22 - 2);
          lVar25 = lVar22;
          psVar19 = r_00;
          local_140 = (ulong)((int)uVar3 - 1);
          do {
            do {
              psVar19->infinity = 1;
              (psVar19->x).n[0] = 0;
              (psVar19->x).n[1] = 0;
              (psVar19->x).n[2] = 0;
              (psVar19->x).n[3] = 0;
              *(undefined1 (*) [16])((psVar19->x).n + 4) = (undefined1  [16])0x0;
              (psVar19->y).n[1] = 0;
              (psVar19->y).n[2] = 0;
              (psVar19->y).n[3] = 0;
              (psVar19->y).n[4] = 0;
              (psVar19->z).n[0] = 0;
              (psVar19->z).n[1] = 0;
              (psVar19->z).n[2] = 0;
              (psVar19->z).n[3] = 0;
              (psVar19->z).n[4] = 0;
              lVar25 = lVar25 + -1;
              psVar19 = psVar19 + 1;
            } while (lVar25 != 0);
            lVar26 = 8;
            lVar25 = lVar20;
            lVar21 = local_148;
            do {
              uVar17 = *(uint *)(*plVar12 + lVar25);
              lVar1 = *(long *)(plVar12[1] + lVar26);
              if ((local_140 == 0) && (*(int *)(plVar12[1] + -8 + lVar26) != 0)) {
                secp256k1_ge_neg((secp256k1_ge *)local_b8,p1 + lVar1);
                secp256k1_gej_add_ge_var(r_00,r_00,(secp256k1_ge *)local_b8,(secp256k1_fe *)0x0);
              }
              if ((int)uVar17 < 1) {
                if ((int)uVar17 < 0) {
                  uVar17 = ~uVar17;
                  psVar14 = (secp256k1_ge *)local_b8;
                  secp256k1_ge_neg(psVar14,p1 + lVar1);
                  goto LAB_001653bd;
                }
              }
              else {
                uVar17 = uVar17 - 1;
                psVar14 = p1 + lVar1;
LAB_001653bd:
                secp256k1_gej_add_ge_var
                          (r_00 + (uVar17 >> 1),r_00 + (uVar17 >> 1),psVar14,(secp256k1_fe *)0x0);
              }
              lVar26 = lVar26 + 0x10;
              lVar25 = lVar25 + ((uVar8 + 0x80) / (uVar8 + 1)) * 4;
              lVar21 = lVar21 + -1;
              uVar17 = uVar9;
            } while (lVar21 != 0);
            do {
              if (r->infinity == 0) {
                secp256k1_gej_double(r,r);
              }
              else {
                r->infinity = 1;
                (r->x).n[0] = 0;
                (r->x).n[1] = 0;
                (r->x).n[2] = 0;
                (r->x).n[3] = 0;
                *(undefined1 (*) [16])((r->x).n + 4) = (undefined1  [16])0x0;
                (r->y).n[1] = 0;
                (r->y).n[2] = 0;
                (r->y).n[3] = 0;
                (r->y).n[4] = 0;
                (r->z).n[0] = 0;
                (r->z).n[1] = 0;
                (r->z).n[2] = 0;
                (r->z).n[3] = 0;
                (r->z).n[4] = 0;
              }
              uVar17 = uVar17 - 1;
            } while (uVar17 != 0);
            local_40 = 1;
            local_b8._0_16_ = (undefined1  [16])0x0;
            local_b8._16_16_ = (undefined1  [16])0x0;
            local_98 = (undefined1  [16])0x0;
            local_88 = (undefined1  [16])0x0;
            local_78 = (undefined1  [16])0x0;
            local_68 = (undefined1  [16])0x0;
            local_58 = (undefined1  [16])0x0;
            local_48 = 0;
            lVar25 = uVar15 + 2;
            psVar19 = r_00 + uVar15 + 1;
            do {
              secp256k1_gej_add_var
                        ((secp256k1_gej *)local_b8,(secp256k1_gej *)local_b8,psVar19,
                         (secp256k1_fe *)0x0);
              secp256k1_gej_add_var(r,r,(secp256k1_gej *)local_b8,(secp256k1_fe *)0x0);
              lVar25 = lVar25 + -1;
              psVar19 = psVar19 + -1;
            } while (1 < lVar25);
            secp256k1_gej_add_var
                      ((secp256k1_gej *)local_b8,(secp256k1_gej *)local_b8,r_00,(secp256k1_fe *)0x0)
            ;
            if (r->infinity == 0) {
              secp256k1_gej_double(r,r);
            }
            else {
              r->infinity = 1;
              (r->x).n[0] = 0;
              (r->x).n[1] = 0;
              (r->x).n[2] = 0;
              (r->x).n[3] = 0;
              *(undefined1 (*) [16])((r->x).n + 4) = (undefined1  [16])0x0;
              (r->y).n[1] = 0;
              (r->y).n[2] = 0;
              (r->y).n[3] = 0;
              (r->y).n[4] = 0;
              (r->z).n[0] = 0;
              (r->z).n[1] = 0;
              (r->z).n[2] = 0;
              (r->z).n[3] = 0;
              (r->z).n[4] = 0;
            }
            secp256k1_gej_add_var(r,r,(secp256k1_gej *)local_b8,(secp256k1_fe *)0x0);
            lVar20 = lVar20 + -4;
            bVar2 = 0 < (long)local_140;
            lVar25 = lVar22;
            psVar19 = r_00;
            local_140 = local_140 - 1;
          } while (bVar2);
        }
        if (lVar11 != 0) {
          lVar25 = 0;
          __n = ((uVar8 | 0x80) / (uVar8 + 1)) * 4;
          lVar20 = 0;
          do {
            *(undefined1 (*) [16])((long)s1->d + lVar20 * 2 + 0x10) = (undefined1  [16])0x0;
            *(undefined1 (*) [16])((long)s1->d + lVar20 * 2) = (undefined1  [16])0x0;
            *(undefined4 *)(plVar12[1] + lVar20) = 0;
            memset((void *)(*plVar12 + lVar25),0,__n);
            lVar20 = lVar20 + 0x10;
            lVar25 = lVar25 + __n;
            lVar11 = lVar11 + -1;
          } while (lVar11 != 0);
        }
        iVar16 = 1;
        uVar9 = 1;
        do {
          *(undefined1 (*) [16])((long)(r_00->z).n + 0x1c) = (undefined1  [16])0x0;
          (r_00->z).n[2] = 0;
          (r_00->z).n[3] = 0;
          (r_00->z).n[0] = 0;
          (r_00->z).n[1] = 0;
          (r_00->y).n[3] = 0;
          (r_00->y).n[4] = 0;
          (r_00->y).n[1] = 0;
          (r_00->y).n[2] = 0;
          *(undefined1 (*) [16])((r_00->x).n + 4) = (undefined1  [16])0x0;
          (r_00->x).n[2] = 0;
          (r_00->x).n[3] = 0;
          (r_00->x).n[0] = 0;
          (r_00->x).n[1] = 0;
          r_00 = r_00 + 1;
          uVar17 = uVar9 >> (bVar4 & 0x1f);
          uVar9 = uVar9 + 1;
        } while (uVar17 == 0);
      }
    }
    secp256k1_scratch_apply_checkpoint(error_callback,scratch,checkpoint);
  }
  return iVar16;
}

Assistant:

static int secp256k1_ecmult_pippenger_batch(const secp256k1_callback* error_callback, secp256k1_scratch *scratch, secp256k1_gej *r, const secp256k1_scalar *inp_g_sc, secp256k1_ecmult_multi_callback cb, void *cbdata, size_t n_points, size_t cb_offset) {
    const size_t scratch_checkpoint = secp256k1_scratch_checkpoint(error_callback, scratch);
    /* Use 2(n+1) with the endomorphism, when calculating batch
     * sizes. The reason for +1 is that we add the G scalar to the list of
     * other scalars. */
    size_t entries = 2*n_points + 2;
    secp256k1_ge *points;
    secp256k1_scalar *scalars;
    secp256k1_gej *buckets;
    struct secp256k1_pippenger_state *state_space;
    size_t idx = 0;
    size_t point_idx = 0;
    int i, j;
    int bucket_window;

    secp256k1_gej_set_infinity(r);
    if (inp_g_sc == NULL && n_points == 0) {
        return 1;
    }
    bucket_window = secp256k1_pippenger_bucket_window(n_points);

    /* We allocate PIPPENGER_SCRATCH_OBJECTS objects on the scratch space. If
     * these allocations change, make sure to update the
     * PIPPENGER_SCRATCH_OBJECTS constant and pippenger_scratch_size
     * accordingly. */
    points = (secp256k1_ge *) secp256k1_scratch_alloc(error_callback, scratch, entries * sizeof(*points));
    scalars = (secp256k1_scalar *) secp256k1_scratch_alloc(error_callback, scratch, entries * sizeof(*scalars));
    state_space = (struct secp256k1_pippenger_state *) secp256k1_scratch_alloc(error_callback, scratch, sizeof(*state_space));
    if (points == NULL || scalars == NULL || state_space == NULL) {
        secp256k1_scratch_apply_checkpoint(error_callback, scratch, scratch_checkpoint);
        return 0;
    }
    state_space->ps = (struct secp256k1_pippenger_point_state *) secp256k1_scratch_alloc(error_callback, scratch, entries * sizeof(*state_space->ps));
    state_space->wnaf_na = (int *) secp256k1_scratch_alloc(error_callback, scratch, entries*(WNAF_SIZE(bucket_window+1)) * sizeof(int));
    buckets = (secp256k1_gej *) secp256k1_scratch_alloc(error_callback, scratch, ((size_t)1 << bucket_window) * sizeof(*buckets));
    if (state_space->ps == NULL || state_space->wnaf_na == NULL || buckets == NULL) {
        secp256k1_scratch_apply_checkpoint(error_callback, scratch, scratch_checkpoint);
        return 0;
    }

    if (inp_g_sc != NULL) {
        scalars[0] = *inp_g_sc;
        points[0] = secp256k1_ge_const_g;
        idx++;
        secp256k1_ecmult_endo_split(&scalars[0], &scalars[1], &points[0], &points[1]);
        idx++;
    }

    while (point_idx < n_points) {
        if (!cb(&scalars[idx], &points[idx], point_idx + cb_offset, cbdata)) {
            secp256k1_scratch_apply_checkpoint(error_callback, scratch, scratch_checkpoint);
            return 0;
        }
        idx++;
        secp256k1_ecmult_endo_split(&scalars[idx - 1], &scalars[idx], &points[idx - 1], &points[idx]);
        idx++;
        point_idx++;
    }

    secp256k1_ecmult_pippenger_wnaf(buckets, bucket_window, state_space, r, scalars, points, idx);

    /* Clear data */
    for(i = 0; (size_t)i < idx; i++) {
        secp256k1_scalar_clear(&scalars[i]);
        state_space->ps[i].skew_na = 0;
        for(j = 0; j < WNAF_SIZE(bucket_window+1); j++) {
            state_space->wnaf_na[i * WNAF_SIZE(bucket_window+1) + j] = 0;
        }
    }
    for(i = 0; i < 1<<bucket_window; i++) {
        secp256k1_gej_clear(&buckets[i]);
    }
    secp256k1_scratch_apply_checkpoint(error_callback, scratch, scratch_checkpoint);
    return 1;
}